

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

ssize_t parse_ncname(char *ncname)

{
  uint uVar1;
  LY_ERR LVar2;
  size_t sVar3;
  int iVar4;
  uint32_t *puVar5;
  char *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint32_t uc;
  size_t size;
  uint local_34;
  size_t local_30;
  char *local_28;
  
  local_28 = in_RDI;
  LVar2 = ly_getutf8(&local_28,&local_34,&local_30);
  if (LVar2 != LY_SUCCESS) goto LAB_001a3c52;
  uVar1 = (local_34 & 0xffffffdf) - 0x41;
  if ((uVar1 < 0x1a || local_34 == 0x5f) || (local_34 != 0x37e && local_34 - 0x370 < 0x1c90)) {
LAB_001a3ca2:
    sVar3 = local_30;
    if (*local_28 != '\0') {
      do {
        puVar5 = &local_34;
        LVar2 = ly_getutf8(&local_28,&local_34,&local_30);
        if (LVar2 != LY_SUCCESS) {
          return -sVar3;
        }
        if (((0x19 < local_34 - 0x61) && (local_34 != 0x2d)) && (local_34 != 0x5f)) {
          if (local_34 - 0x30 < 10 || local_34 - 0x41 < 0x1a) {
LAB_001a3d0e:
            if (local_34 == 0x3a) {
              return sVar3;
            }
          }
          else if (((local_34 != 0x2e) && (local_34 != 0xb7)) &&
                  (local_34 == 0x37e || 0x1c8f < local_34 - 0x370)) {
            auVar6._0_4_ = -(uint)(-0x7fffff91 < (int)(local_34 - 0x300 ^ 0x80000000));
            auVar6._4_4_ = -(uint)(-0x7ffffee1 < (int)(local_34 - 0x2070 ^ 0x80000000));
            auVar6._8_4_ = -(uint)(-0x7fffffff < (int)(local_34 - 0x203f ^ 0x80000000));
            auVar6._12_4_ = -(uint)(-0x7ffffc11 < (int)(local_34 - 0x2c00 ^ 0x80000000));
            iVar4 = movmskps((int)puVar5,auVar6);
            if (((((iVar4 != 0xf) || (local_34 - 0x3001 < 0xa7ff)) || (local_34 - 0xf900 < 0x4d0))
                || ((local_34 - 0xfdf0 < 0x20e || ((local_34 & 0xfffffffe) == 0x200c)))) ||
               (local_34 - 0xc0 < 0x240 && (local_34 & 0xffffffdf) != 0xd7)) goto LAB_001a3d0e;
            if (0xdffff < local_34 - 0x10000) {
              return sVar3;
            }
          }
        }
        sVar3 = sVar3 + local_30;
      } while (*local_28 != '\0');
    }
  }
  else {
    auVar7._0_4_ = -(uint)(-0x7ffffee1 < (int)(local_34 - 0x2070 ^ 0x80000000));
    auVar7._4_4_ = -(uint)(-0x7ffffc11 < (int)(local_34 - 0x2c00 ^ 0x80000000));
    auVar7._8_4_ = -(uint)(-0x7fff5802 < (int)(local_34 - 0x3001 ^ 0x80000000));
    auVar7._12_4_ = -(uint)(-0x7ffffb31 < (int)(local_34 - 0xf900 ^ 0x80000000));
    iVar4 = movmskps(CONCAT31((int3)(uVar1 >> 8),local_34 != 0x37e),auVar7);
    if ((iVar4 == 0xf) &&
       (((0x20d < local_34 - 0xfdf0 && ((local_34 & 0xfffffffe) != 0x200c)) &&
        (0x23f < local_34 - 0xc0 || (local_34 & 0xffffffdf) == 0xd7)))) {
      if (0xfff1ffff < local_34 - 0xf0000) goto LAB_001a3ca2;
    }
    else if (local_34 != 0x3a) goto LAB_001a3ca2;
LAB_001a3c52:
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static ssize_t
parse_ncname(const char *ncname)
{
    uint32_t uc;
    size_t size;
    ssize_t len = 0;

    LY_CHECK_RET(ly_getutf8(&ncname, &uc, &size), 0);
    if (!is_xmlqnamestartchar(uc) || (uc == ':')) {
        return len;
    }

    do {
        len += size;
        if (!*ncname) {
            break;
        }
        LY_CHECK_RET(ly_getutf8(&ncname, &uc, &size), -len);
    } while (is_xmlqnamechar(uc) && (uc != ':'));

    return len;
}